

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O0

void ncnn::copy_make_border
               (Mat *src,Mat *dst,int top,int bottom,int left,int right,int type,float v,
               Allocator *allocator,int num_threads)

{
  Layer *pLVar1;
  Option *pOVar2;
  int in_ECX;
  int in_EDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  int in_R8D;
  int in_R9D;
  float in_XMM0_Da;
  int in_stack_00000008;
  undefined4 in_stack_00000018;
  Option opt;
  ParamDict pd;
  Layer *padding;
  int in_stack_fffffffffffffa7c;
  ParamDict *this;
  undefined4 local_568;
  undefined4 uStack_564;
  Allocator *local_558;
  undefined1 local_540 [16];
  ParamDict *in_stack_fffffffffffffad0;
  
  pLVar1 = create_layer(in_stack_fffffffffffffa7c);
  this = (ParamDict *)local_540;
  ParamDict::ParamDict(in_stack_fffffffffffffad0);
  ParamDict::set(this,0,in_EDX);
  ParamDict::set((ParamDict *)local_540,1,in_ECX);
  ParamDict::set((ParamDict *)local_540,2,in_R8D);
  ParamDict::set((ParamDict *)local_540,3,in_R9D);
  ParamDict::set((ParamDict *)local_540,4,in_stack_00000008);
  ParamDict::set((ParamDict *)local_540,5,in_XMM0_Da);
  (*pLVar1->_vptr_Layer[2])(pLVar1,local_540);
  pOVar2 = get_default_option();
  local_558 = pOVar2->workspace_allocator;
  local_568 = *(undefined4 *)pOVar2;
  uStack_564 = in_stack_00000018;
  (*pLVar1->_vptr_Layer[5])(pLVar1,in_RDI,in_RSI,&local_568);
  if (pLVar1 != (Layer *)0x0) {
    (*pLVar1->_vptr_Layer[1])();
  }
  ParamDict::~ParamDict(this);
  return;
}

Assistant:

void copy_make_border(const Mat& src, Mat& dst, int top, int bottom, int left, int right, int type, float v, Allocator* allocator, int num_threads)
{
    ncnn::Layer* padding = ncnn::create_layer(ncnn::LayerType::Padding);

    ncnn::ParamDict pd;
    pd.set(0, top);
    pd.set(1, bottom);
    pd.set(2, left);
    pd.set(3, right);
    pd.set(4, type);
    pd.set(5, v);

    padding->load_param(pd);

    ncnn::Option opt = ncnn::get_default_option();
    opt.num_threads = num_threads;
    opt.blob_allocator = allocator;

    padding->forward(src, dst, opt);

    delete padding;
}